

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *v,int components,float v_speed,
                       void *v_min,void *v_max,char *format,float power)

{
  size_t sVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  char *text_end;
  int local_6c;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  float power_local;
  void *v_max_local;
  void *v_min_local;
  float v_speed_local;
  int components_local;
  void *v_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    label_local._7_1_ = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,0.0);
    sVar1 = GDataTypeInfo[data_type].Size;
    _v_speed_local = v;
    for (local_6c = 0; local_6c < components; local_6c = local_6c + 1) {
      PushID(local_6c);
      bVar3 = DragScalar("##v",data_type,_v_speed_local,v_speed,v_min,v_max,format,power);
      label_local._7_1_ = label_local._7_1_ != false || bVar3;
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
      _v_speed_local = (void *)((long)_v_speed_local + sVar1);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* v, int components, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= DragScalar("##v", data_type, v, v_speed, v_min, v_max, format, power);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    return value_changed;
}